

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pac_conn.cc
# Opt level: O3

void __thiscall ConnDecl::GenProcessFunc(ConnDecl *this,Output *out_h,Output *out_cc)

{
  char *pcVar1;
  string proto;
  string local_60;
  string local_40;
  
  strfmt_abi_cxx11_(&local_40,"%s(bool is_orig, const_byteptr begin, const_byteptr end)","NewData");
  Output::println(out_h,"void %s;",local_40._M_dataplus._M_p);
  AnalyzerDecl::class_name_abi_cxx11_(&local_60,&this->super_AnalyzerDecl);
  Output::println(out_cc,"void %s::%s",local_60._M_dataplus._M_p,local_40._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  out_cc->indent_ = out_cc->indent_ + 1;
  Output::println(out_cc,"{");
  Output::println(out_cc,"if ( is_orig )");
  out_cc->indent_ = out_cc->indent_ + 1;
  pcVar1 = Env::LValue((this->super_AnalyzerDecl).super_TypeDecl.env_,upflow_id);
  Output::println(out_cc,"%s->%s(begin, end);",pcVar1,"NewData");
  out_cc->indent_ = out_cc->indent_ + -1;
  Output::println(out_cc,"else");
  out_cc->indent_ = out_cc->indent_ + 1;
  pcVar1 = Env::LValue((this->super_AnalyzerDecl).super_TypeDecl.env_,downflow_id);
  Output::println(out_cc,"%s->%s(begin, end);",pcVar1,"NewData");
  out_cc->indent_ = out_cc->indent_ + -1;
  Output::println(out_cc,"}");
  out_cc->indent_ = out_cc->indent_ + -1;
  Output::println(out_cc,"");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void ConnDecl::GenProcessFunc(Output* out_h, Output* out_cc)
	{
	string proto = strfmt("%s(bool is_orig, const_byteptr begin, const_byteptr end)", kNewData);

	out_h->println("void %s;", proto.c_str());

	out_cc->println("void %s::%s", class_name().c_str(), proto.c_str());
	out_cc->inc_indent();
	out_cc->println("{");

	out_cc->println("if ( is_orig )");
	out_cc->inc_indent();
	out_cc->println("%s->%s(begin, end);", env_->LValue(upflow_id), kNewData);
	out_cc->dec_indent();
	out_cc->println("else");
	out_cc->inc_indent();
	out_cc->println("%s->%s(begin, end);", env_->LValue(downflow_id), kNewData);
	out_cc->dec_indent();

	out_cc->println("}");
	out_cc->dec_indent();
	out_cc->println("");
	}